

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::
AddImmutableSampler<Diligent::ImmutableSamplerDesc_const&>
          (PipelineResourceSignatureDescWrapper *this,ImmutableSamplerDesc *Args)

{
  pointer *ppIVar1;
  pointer pIVar2;
  undefined4 uVar3;
  uint uVar4;
  long lVar5;
  __hashtable *__h;
  iterator __position;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar6;
  __node_gen_type __node_gen;
  allocator local_41;
  long *local_40 [2];
  long local_30 [2];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  
  __position._M_current =
       (this->m_ImmutableSamplers).
       super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_ImmutableSamplers).
      super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>::
    _M_realloc_insert<Diligent::ImmutableSamplerDesc_const&>
              ((vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>
                *)&this->m_ImmutableSamplers,__position,Args);
  }
  else {
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      uVar3 = *(undefined4 *)&Args->field_0x4;
      (__position._M_current)->ShaderStages = Args->ShaderStages;
      *(undefined4 *)&(__position._M_current)->field_0x4 = uVar3;
      Args = (ImmutableSamplerDesc *)&Args->SamplerOrTextureName;
      __position._M_current = (ImmutableSamplerDesc *)&(__position._M_current)->SamplerOrTextureName
      ;
    }
    ppIVar1 = &(this->m_ImmutableSamplers).
               super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  local_40[0] = (long *)(((long)(this->m_ImmutableSamplers).
                                super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_ImmutableSamplers).
                                super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x71c71c71c71c71c7);
  uVar4 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_40);
  (this->m_Desc).NumImmutableSamplers = uVar4;
  pIVar2 = (this->m_ImmutableSamplers).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_Desc).ImmutableSamplers =
       (this->m_ImmutableSamplers).
       super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
       ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)local_40,pIVar2[-1].SamplerOrTextureName,&local_41);
  local_20 = &this->m_StringPool;
  pVar6 = std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_20,(string *)local_40);
  pIVar2[-1].SamplerOrTextureName =
       *(Char **)((long)pVar6.first.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 + 8);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void AddImmutableSampler(ArgsType&&... Args)
    {
        m_ImmutableSamplers.emplace_back(std::forward<ArgsType>(Args)...);
        m_Desc.NumImmutableSamplers = StaticCast<Uint32>(m_ImmutableSamplers.size());
        m_Desc.ImmutableSamplers    = m_ImmutableSamplers.data();

        ImmutableSamplerDesc& ImtblSam{m_ImmutableSamplers.back()};
        ImtblSam.SamplerOrTextureName = m_StringPool.insert(ImtblSam.SamplerOrTextureName).first->c_str();
    }